

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength::Run(AdvancedUnsizedArrayLength *this)

{
  bool bVar1;
  GLuint GVar2;
  bool local_119;
  uint local_118;
  uint uStack_114;
  bool status;
  int data_5 [5];
  undefined1 local_f8 [8];
  int data_4 [5];
  undefined8 local_d8;
  int data_3 [4];
  int data_2 [3];
  int data_1 [5];
  undefined8 local_98;
  int data [7];
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_vs;
  AdvancedUnsizedArrayLength *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,5)
  ;
  if (bVar1) {
    local_20 = 
    "\nlayout(std430, binding = 0) readonly buffer Input0 {\n  int g_input0[];\n};\nlayout(std430, binding = 1) readonly buffer Input1 {\n  int data[];\n} g_input1;\nlayout(std430, binding = 2) readonly buffer Input23 {\n  int data[];\n} g_input23[2];\nlayout(std430, binding = 4) buffer Output {\n  int g_length[4];\n  int g_length2;\n};\nvoid main() {\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length2 = g_length.length();\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "\nlayout(std430, binding = 0) readonly buffer Input0 {\n  int g_input0[];\n};\nlayout(std430, binding = 1) readonly buffer Input1 {\n  int data[];\n} g_input1;\nlayout(std430, binding = 2) readonly buffer Input23 {\n  int data[];\n} g_input23[2];\nlayout(std430, binding = 4) buffer Output {\n  int g_length[4];\n  int g_length2;\n};\nvoid main() {\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length2 = g_length.length();\n}"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(data + 6),"",(allocator<char> *)((long)data + 0x17));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_40,(string *)(data + 6));
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)(data + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)data + 0x17));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,this->m_storage_buffer);
      local_98 = 0x200000001;
      data[0] = 3;
      data[1] = 4;
      data[2] = 5;
      data[3] = 6;
      data[4] = 7;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x1c,&local_98,0x88ea);
      data_2[1] = 1;
      data_2[2] = 2;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x14,data_2 + 1,0x88ea);
      stack0xffffffffffffff3c = 0x200000001;
      data_2[0] = 3;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0xc,data_3 + 3,0x88ea);
      local_d8 = 0x200000001;
      data_3[0] = 3;
      data_3[1] = 4;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,3,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,&local_d8,0x88ea);
      memset(local_f8,0,0x14);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x14,local_f8,0x88ea);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0x14,&local_118);
      if (local_118 != 7) {
        anon_unknown_0::Output("Array 0 length is %d should be 7.\n",(ulong)local_118);
      }
      local_119 = local_118 == 7;
      if (uStack_114 != 5) {
        anon_unknown_0::Output("Array 1 length is %d should be 5.\n",(ulong)uStack_114);
        local_119 = false;
      }
      if (data_5[0] != 3) {
        anon_unknown_0::Output("Array 2 length is %d should be 3.\n",(ulong)(uint)data_5[0]);
        local_119 = false;
      }
      if (data_5[1] != 4) {
        anon_unknown_0::Output("Array 3 length is %d should be 4.\n",(ulong)(uint)data_5[1]);
        local_119 = false;
      }
      if (data_5[2] != 4) {
        anon_unknown_0::Output("Array 4 length is %d should be 4.\n",(ulong)(uint)data_5[2]);
        local_119 = false;
      }
      if (local_119) {
        this_local = (AdvancedUnsizedArrayLength *)0x0;
      }
      else {
        this_local = (AdvancedUnsizedArrayLength *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedUnsizedArrayLength *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUnsizedArrayLength *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(5))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) readonly buffer Input0 {" NL "  int g_input0[];" NL "};" NL
			   "layout(std430, binding = 1) readonly buffer Input1 {" NL "  int data[];" NL "} g_input1;" NL
			   "layout(std430, binding = 2) readonly buffer Input23 {" NL "  int data[];" NL "} g_input23[2];" NL
			   "layout(std430, binding = 4) buffer Output {" NL "  int g_length[4];" NL "  int g_length2;" NL "};" NL
			   "void main() {" NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length2 = g_length.length();" NL "}";

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(5, m_storage_buffer);

		/* input 0 */
		{
			int data[7] = { 1, 2, 3, 4, 5, 6, 7 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 1 */
		{
			int data[5] = { 1, 2, 3, 4, 5 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 2 */
		{
			int data[3] = { 1, 2, 3 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 3 */
		{
			int data[4] = { 1, 2, 3, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* output */
		{
			int data[5] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* output */
		{
			int data[5];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			bool status = true;
			if (data[0] != 7)
			{
				Output("Array 0 length is %d should be 7.\n", data[0]);
				status = false;
			}
			if (data[1] != 5)
			{
				Output("Array 1 length is %d should be 5.\n", data[1]);
				status = false;
			}
			if (data[2] != 3)
			{
				Output("Array 2 length is %d should be 3.\n", data[2]);
				status = false;
			}
			if (data[3] != 4)
			{
				Output("Array 3 length is %d should be 4.\n", data[3]);
				status = false;
			}
			if (data[4] != 4)
			{
				Output("Array 4 length is %d should be 4.\n", data[4]);
				status = false;
			}
			if (!status)
				return ERROR;
		}

		return NO_ERROR;
	}